

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBillboardSceneNode.cpp
# Opt level: O1

void __thiscall
irr::scene::CBillboardSceneNode::CBillboardSceneNode
          (CBillboardSceneNode *this,ISceneNode *parent,ISceneManager *mgr,s32 id,
          vector3df *position,dimension2d<float> *size,SColor colorTop,SColor colorBottom)

{
  SMeshBuffer *pSVar1;
  pointer puVar2;
  pointer pSVar3;
  CMeshBuffer<irr::video::S3DVertex> *this_00;
  
  *(undefined ***)&this->field_0x118 = &PTR__IReferenceCounted_00261738;
  *(undefined8 *)&this->field_0x120 = 0;
  *(undefined4 *)&this->field_0x128 = 1;
  IBillboardSceneNode::IBillboardSceneNode
            ((IBillboardSceneNode *)&this->field_0x38,&PTR_construction_vtable_384__002636f0,parent,
             mgr,id,position);
  this->_vptr_CBillboardSceneNode = (_func_int **)0x263328;
  *(undefined8 *)&this->field_0x38 = 0x263540;
  *(undefined8 *)&this->field_0x118 = 0x2636c8;
  (this->Size).Width = 0.0;
  (this->Size).Height = 0.0;
  (this->BBoxSafe).MinEdge.X = -1.0;
  (this->BBoxSafe).MinEdge.Y = -1.0;
  *(undefined8 *)&(this->BBoxSafe).MinEdge.Z = 0x3f800000bf800000;
  (this->BBoxSafe).MaxEdge.Y = 1.0;
  (this->BBoxSafe).MaxEdge.Z = 1.0;
  this_00 = (CMeshBuffer<irr::video::S3DVertex> *)operator_new(0x150);
  CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer(this_00);
  this->Buffer = this_00;
  (*this->_vptr_CBillboardSceneNode[5])(this,size);
  ::std::vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>::resize
            ((vector<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_> *)
             &this->Buffer->Vertices,4);
  ::std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&(this->Buffer->Indices).m_data,6);
  pSVar1 = this->Buffer;
  puVar2 = (pSVar1->Indices).m_data.
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2[0] = 0;
  puVar2[1] = 2;
  puVar2[2] = 1;
  puVar2[3] = 0;
  puVar2[4] = 3;
  puVar2[5] = 2;
  pSVar3 = (pSVar1->Vertices).m_data.
           super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl
           .super__Vector_impl_data._M_start;
  (pSVar3->TCoords).X = 1.0;
  (pSVar3->TCoords).Y = 1.0;
  (pSVar3->Color).color = colorBottom.color;
  pSVar3[1].TCoords.X = 1.0;
  pSVar3[1].TCoords.Y = 0.0;
  pSVar3[1].Color.color = colorTop.color;
  pSVar3[2].TCoords.X = 0.0;
  pSVar3[2].TCoords.Y = 0.0;
  pSVar3[2].Color.color = colorTop.color;
  pSVar3[3].TCoords.X = 0.0;
  pSVar3[3].TCoords.Y = 1.0;
  pSVar3[3].Color.color = colorBottom.color;
  return;
}

Assistant:

CBillboardSceneNode::CBillboardSceneNode(ISceneNode *parent, ISceneManager *mgr, s32 id,
		const core::vector3df &position, const core::dimension2d<f32> &size,
		video::SColor colorTop, video::SColor colorBottom) :
		IBillboardSceneNode(parent, mgr, id, position),
		Buffer(new SMeshBuffer())
{
#ifdef _DEBUG
	setDebugName("CBillboardSceneNode");
#endif

	setSize(size);

	Buffer->Vertices.set_used(4);
	Buffer->Indices.set_used(6);

	Buffer->Indices[0] = 0;
	Buffer->Indices[1] = 2;
	Buffer->Indices[2] = 1;
	Buffer->Indices[3] = 0;
	Buffer->Indices[4] = 3;
	Buffer->Indices[5] = 2;

	Buffer->Vertices[0].TCoords.set(1.0f, 1.0f);
	Buffer->Vertices[0].Color = colorBottom;

	Buffer->Vertices[1].TCoords.set(1.0f, 0.0f);
	Buffer->Vertices[1].Color = colorTop;

	Buffer->Vertices[2].TCoords.set(0.0f, 0.0f);
	Buffer->Vertices[2].Color = colorTop;

	Buffer->Vertices[3].TCoords.set(0.0f, 1.0f);
	Buffer->Vertices[3].Color = colorBottom;
}